

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::Clear(CharSet<unsigned_int> *this,ArenaAllocator *allocator)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x2a8; lVar1 = lVar1 + 0x28) {
    CharSet<char16_t>::Clear
              ((CharSet<char16_t> *)((long)&this->characterPlanes[0].rep + lVar1),allocator);
  }
  return;
}

Assistant:

void CharSet<codepoint_t>::Clear(ArenaAllocator* allocator)
    {
        for (int i = 0; i < NumberOfPlanes; i++)
        {
            this->characterPlanes[i].Clear(allocator);
        }
    }